

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

void __thiscall nuraft::rpc_session::prepare_handshake(rpc_session *this)

{
  bool bVar1;
  port_type pVar2;
  element_type *peVar3;
  undefined8 uVar4;
  _Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>
  *token;
  long in_RDI;
  ptr<rpc_session> self;
  basic_endpoint<asio::ip::tcp> *in_stack_fffffffffffffeb8;
  shared_ptr<nuraft::rpc_session> *in_stack_fffffffffffffec0;
  address *in_stack_fffffffffffffec8;
  stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>
  *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  basic_socket<asio::ip::tcp,_asio::any_io_executor> *in_stack_fffffffffffffee8;
  basic_socket<asio::ip::tcp,_asio::any_io_executor> *this_00;
  shared_ptr<nuraft::rpc_session> local_108;
  code *local_f0;
  ptr<rpc_session> *in_stack_ffffffffffffff18;
  rpc_session *in_stack_ffffffffffffff20;
  string local_b8 [100];
  undefined1 local_54 [84];
  
  std::enable_shared_from_this<nuraft::rpc_session>::shared_from_this
            ((enable_shared_from_this<nuraft::rpc_session> *)in_stack_fffffffffffffeb8);
  asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::remote_endpoint
            (in_stack_fffffffffffffee8);
  this_00 = (basic_socket<asio::ip::tcp,_asio::any_io_executor> *)local_54;
  asio::ip::basic_endpoint<asio::ip::tcp>::address(in_stack_fffffffffffffeb8);
  asio::ip::address::to_string_abi_cxx11_(in_stack_fffffffffffffec8);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x250),(string *)(local_54 + 0x1c));
  std::__cxx11::string::~string((string *)(local_54 + 0x1c));
  asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::remote_endpoint(this_00);
  pVar2 = asio::ip::basic_endpoint<asio::ip::tcp>::port((basic_endpoint<asio::ip::tcp> *)0x290f4c);
  *(uint *)(in_RDI + 0x270) = (uint)pVar2;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x218));
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x290f80);
    in_stack_fffffffffffffedc = (*peVar3->_vptr_logger[7])();
    if (3 < in_stack_fffffffffffffedc) {
      in_stack_fffffffffffffec8 =
           (address *)
           std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x290fb0);
      in_stack_fffffffffffffed0 =
           *(stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&> **)
            (in_RDI + 0x10);
      uVar4 = std::__cxx11::string::c_str();
      msg_if_given_abi_cxx11_
                ((char *)local_b8,"session %lu got connection from %s:%u (as a server)",
                 in_stack_fffffffffffffed0,uVar4,(ulong)*(uint *)(in_RDI + 0x270));
      (*(*(_func_int ***)in_stack_fffffffffffffec8)[8])
                (in_stack_fffffffffffffec8,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                 ,"prepare_handshake",0x106,local_b8);
      std::__cxx11::string::~string(local_b8);
    }
  }
  if ((*(byte *)(in_RDI + 0x1f0) & 1) == 0) {
    std::shared_ptr<nuraft::rpc_session>::shared_ptr(in_stack_fffffffffffffec0,&local_108);
    start(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    std::shared_ptr<nuraft::rpc_session>::~shared_ptr((shared_ptr<nuraft::rpc_session> *)0x291151);
  }
  else {
    token = (_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>
             *)(in_RDI + 0x88);
    local_f0 = handle_handshake;
    std::
    bind<void(nuraft::rpc_session::*)(std::shared_ptr<nuraft::rpc_session>,std::error_code_const&),nuraft::rpc_session*,std::shared_ptr<nuraft::rpc_session>&,std::_Placeholder<1>const&>
              ((offset_in_rpc_session_to_subr *)
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
               (rpc_session **)in_stack_fffffffffffffed0,
               (shared_ptr<nuraft::rpc_session> *)in_stack_fffffffffffffec8,(_Placeholder<1> *)token
              );
    asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>::
    async_handshake<std::_Bind<void(nuraft::rpc_session::*(nuraft::rpc_session*,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>>
              (in_stack_fffffffffffffed0,(handshake_type)((ulong)in_stack_fffffffffffffec8 >> 0x20),
               token);
    std::
    _Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>
    ::~_Bind((_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>
              *)0x2910ff);
  }
  std::shared_ptr<nuraft::rpc_session>::~shared_ptr((shared_ptr<nuraft::rpc_session> *)0x291180);
  return;
}

Assistant:

void prepare_handshake() {
        // this is safe since we only expose ctor to cs_new
        ptr<rpc_session> self = this->shared_from_this();

        cached_address_ = socket_.remote_endpoint().address().to_string();
        cached_port_ = socket_.remote_endpoint().port();
        p_in( "session %" PRIu64 " got connection from %s:%u (as a server)",
              session_id_,
              cached_address_.c_str(),
              cached_port_ );

        if (ssl_enabled_) {
#ifdef SSL_LIBRARY_NOT_FOUND
            assert(0); // Should not reach here.
#else
            ssl_socket_.async_handshake
                ( asio::ssl::stream_base::server,
                  std::bind( &rpc_session::handle_handshake,
                             this,
                             self,
                             std::placeholders::_1 ) );
#endif
        } else {
            this->start(self);
        }
    }